

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int generate_by_miniscript_or_i
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  int iVar1;
  uchar last_op [1];
  uchar middle_op [1];
  uchar top_op [1];
  size_t indexes [2];
  
  top_op[0] = 'c';
  middle_op[0] = 'g';
  last_op[0] = 'h';
  indexes[0] = 0;
  indexes[1] = 1;
  iVar1 = generate_by_miniscript_concat
                    (node,parent,derive_child_num,2,indexes,top_op,1,middle_op,1,(uchar *)0x0,0,
                     last_op,1,script,script_len,write_len);
  return iVar1;
}

Assistant:

static int generate_by_miniscript_or_i(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    unsigned char top_op[] = {OP_IF};
    unsigned char middle_op[] = {OP_ELSE};
    unsigned char last_op[] = {OP_ENDIF};
    const size_t indexes[] = {0, 1};
    /* IF [X] ELSE [Z] ENDIF */
    return generate_by_miniscript_concat(
        node,
        parent,
        derive_child_num,
        2,
        indexes,
        top_op,
        sizeof(top_op) / sizeof(unsigned char),
        middle_op,
        sizeof(middle_op) / sizeof(unsigned char),
        NULL,
        0,
        last_op,
        sizeof(last_op) / sizeof(unsigned char),
        script,
        script_len,
        write_len);
}